

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.h
# Opt level: O0

LiteralExpr * __thiscall
SQASTReader::newNode<SQCompilation::LiteralExpr,bool>(SQASTReader *this,bool args)

{
  LiteralExpr *pLVar1;
  size_t *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  LiteralExpr *this_00;
  
  this_00 = (LiteralExpr *)*in_RDI;
  pLVar1 = (LiteralExpr *)
           ArenaObj::operator_new
                     ((size_t)this_00,
                      (Arena *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  SQCompilation::LiteralExpr::LiteralExpr(this_00,(bool)in_stack_ffffffffffffffcf);
  return pLVar1;
}

Assistant:

N *newNode(Args... args) {
    return new (astArena) N(args...);
  }